

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parseIdentifierExpression(Parser *this)

{
  TokenType TVar1;
  VariableExpression *this_00;
  FunctionCallExpression *this_01;
  Parser *in_RSI;
  vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
  local_100;
  string local_e8;
  unique_ptr<FunctionCallExpression,_std::default_delete<FunctionCallExpression>_> local_c8;
  allocator local_b9;
  string local_b8;
  undefined1 local_98 [8];
  unique_ptr<Expression,_std::default_delete<Expression>_> arg;
  vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
  arguments;
  string local_70;
  unique_ptr<VariableExpression,_std::default_delete<VariableExpression>_> local_50 [3];
  undefined1 local_38 [8];
  string identifier;
  Parser *this_local;
  
  Token::identifier_abi_cxx11_((string *)local_38,&in_RSI->mCurrentToken);
  nextToken(in_RSI);
  TVar1 = Token::type(&in_RSI->mCurrentToken);
  if (TVar1 == LEFT_PARENTHESIS) {
    nextToken(in_RSI);
    std::
    vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ::vector((vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
              *)&arg);
    TVar1 = Token::type(&in_RSI->mCurrentToken);
    if (TVar1 != RIGHT_PARENTHESIS) {
      do {
        parseExpression((Parser *)local_98);
        std::
        vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
        ::push_back((vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
                     *)&arg,(value_type *)local_98);
        TVar1 = Token::type(&in_RSI->mCurrentToken);
        if (TVar1 == RIGHT_PARENTHESIS) {
          arguments.
          super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 3;
        }
        else {
          TVar1 = Token::type(&in_RSI->mCurrentToken);
          if (TVar1 != COMMA) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_b8,"Expected \',\' or \')\' in argument list.",&local_b9);
            parseError(in_RSI,&local_b8);
            std::__cxx11::string::~string((string *)&local_b8);
            std::allocator<char>::~allocator((allocator<char> *)&local_b9);
          }
          nextToken(in_RSI);
          arguments.
          super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        }
        std::unique_ptr<Expression,_std::default_delete<Expression>_>::~unique_ptr
                  ((unique_ptr<Expression,_std::default_delete<Expression>_> *)local_98);
      } while ((int)arguments.
                    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage == 0);
    }
    nextToken(in_RSI);
    this_01 = (FunctionCallExpression *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_e8,(string *)local_38);
    std::
    vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ::vector(&local_100,
             (vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
              *)&arg);
    FunctionCallExpression::FunctionCallExpression(this_01,&local_e8,&local_100);
    std::unique_ptr<FunctionCallExpression,std::default_delete<FunctionCallExpression>>::
    unique_ptr<std::default_delete<FunctionCallExpression>,void>
              ((unique_ptr<FunctionCallExpression,std::default_delete<FunctionCallExpression>> *)
               &local_c8,this_01);
    std::unique_ptr<Expression,std::default_delete<Expression>>::
    unique_ptr<FunctionCallExpression,std::default_delete<FunctionCallExpression>,void>
              ((unique_ptr<Expression,std::default_delete<Expression>> *)this,&local_c8);
    std::unique_ptr<FunctionCallExpression,_std::default_delete<FunctionCallExpression>_>::
    ~unique_ptr(&local_c8);
    std::
    vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ::~vector(&local_100);
    std::__cxx11::string::~string((string *)&local_e8);
    std::
    vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ::~vector((vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
               *)&arg);
  }
  else {
    this_00 = (VariableExpression *)operator_new(0x28);
    std::__cxx11::string::string((string *)&local_70,(string *)local_38);
    VariableExpression::VariableExpression(this_00,&local_70);
    std::unique_ptr<VariableExpression,std::default_delete<VariableExpression>>::
    unique_ptr<std::default_delete<VariableExpression>,void>
              ((unique_ptr<VariableExpression,std::default_delete<VariableExpression>> *)local_50,
               this_00);
    std::unique_ptr<Expression,std::default_delete<Expression>>::
    unique_ptr<VariableExpression,std::default_delete<VariableExpression>,void>
              ((unique_ptr<Expression,std::default_delete<Expression>> *)this,local_50);
    std::unique_ptr<VariableExpression,_std::default_delete<VariableExpression>_>::~unique_ptr
              (local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)local_38);
  return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
         (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expression> Parser::parseIdentifierExpression() {
	std::string identifier = mCurrentToken.identifier();

	//Eat the identifier.
	nextToken();

	if (mCurrentToken.type() != TokenType::LEFT_PARENTHESIS) {
		return std::unique_ptr<VariableExpression>(new VariableExpression(identifier));
	}

	//Function call
	nextToken(); //Eat the '('
	std::vector<std::unique_ptr<Expression>> arguments;

	if (mCurrentToken.type() != TokenType::RIGHT_PARENTHESIS) {
		while (true) {
			auto arg = parseExpression();
			arguments.push_back(std::move(arg));

			if (mCurrentToken.type() == TokenType::RIGHT_PARENTHESIS) {
				break;
			}

			if (mCurrentToken.type() != TokenType::COMMA) {
				parseError("Expected ',' or ')' in argument list.");
			}

			nextToken();
		}
	}

	//Eat the ')'
	nextToken();

	return std::unique_ptr<FunctionCallExpression>(
		new FunctionCallExpression(identifier, std::move(arguments)));
}